

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSGDiscrete.cpp
# Opt level: O2

void __thiscall
POSGDiscrete::CreateNewRewardModel(POSGDiscrete *this,Index agentI,size_t nrS,size_t nrJA)

{
  reference ppRVar1;
  RewardModelMapping *this_00;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  if (this->_m_initialized == true) {
    ppRVar1 = std::vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>::at
                        (&this->_m_p_rModel,(ulong)agentI);
    if (*ppRVar1 != (value_type)0x0) {
      (*((*ppRVar1)->super_RewardModel).super_RewardModelDiscreteInterface.super_QTableInterface.
        _vptr_QTableInterface[3])();
    }
  }
  this_00 = (RewardModelMapping *)operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"s",&local_71);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"ja",&local_72);
  RewardModelMapping::RewardModelMapping(this_00,nrS,nrJA,&local_50,&local_70);
  ppRVar1 = std::vector<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>::at
                      (&this->_m_p_rModel,(ulong)agentI);
  *ppRVar1 = this_00;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void POSGDiscrete::CreateNewRewardModel
    (Index agentI, size_t nrS, size_t nrJA)
{
    if(_m_initialized)
    delete(_m_p_rModel.at(agentI));

    _m_p_rModel.at(agentI) = new RewardModelMapping( nrS, nrJA);
}